

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O1

void __thiscall
agge::tests::GenericRGBXBlenderTests::AlphaIsMixedFromSrcAlphaAndCover
          (GenericRGBXBlenderTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  color cVar3;
  color cVar4;
  int iVar5;
  long lVar6;
  uint8_t covers [4];
  pixel dest2 [4];
  pixel dest1 [4];
  pixel reference2 [4];
  pixel reference1 [4];
  byte local_bc [4];
  pixel_rgbx<agge::order_rgba> local_b8 [4];
  pixel_rgbx<agge::order_rgba> local_a8 [6];
  string local_90;
  LocationInfo local_70;
  pixel_rgbx<agge::order_rgba> local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_bc[0] = 0x10;
  local_bc[1] = 0x90;
  local_bc[2] = 0xa0;
  local_bc[3] = 0xd0;
  cVar3 = color::make(0x80,0x80,0x80,'0');
  cVar4 = color::make(0x80,0x80,0x80,0xc0);
  lVar6 = 0;
  do {
    *(undefined4 *)(local_a8[0].components + lVar6) = 0x80e08020;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  lVar6 = 0;
  do {
    *(undefined4 *)(local_b8[0].components + lVar6) = 0x80e08020;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  lVar6 = 0;
  do {
    iVar5 = (uint)local_bc[lVar6] *
            ((((uint)cVar3 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar3 >> 0x18) * 0x40);
    if (iVar5 == 0x3fffc0) {
      local_a8[lVar6].components[0] = cVar3.r;
      local_a8[lVar6].components[1] = cVar3.g;
      local_a8[lVar6].components[2] = cVar3.b;
    }
    else {
      local_a8[lVar6].components[0] =
           (char)((((uint)cVar3 & 0xff) - (uint)local_a8[lVar6].components[0]) * iVar5 >> 0x16) +
           local_a8[lVar6].components[0];
      local_a8[lVar6].components[1] =
           (char)((((uint)cVar3 >> 8 & 0xff) - (uint)local_a8[lVar6].components[1]) * iVar5 >> 0x16)
           + local_a8[lVar6].components[1];
      local_a8[lVar6].components[2] =
           (char)((((uint)cVar3 >> 0x10 & 0xff) - (uint)local_a8[lVar6].components[2]) * iVar5 >>
                 0x16) + local_a8[lVar6].components[2];
    }
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 4);
  lVar6 = 0;
  do {
    iVar5 = (uint)local_bc[lVar6] *
            ((((uint)cVar4 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar4 >> 0x18) * 0x40);
    if (iVar5 == 0x3fffc0) {
      local_b8[lVar6].components[0] = cVar4.r;
      local_b8[lVar6].components[1] = cVar4.g;
      local_b8[lVar6].components[2] = cVar4.b;
    }
    else {
      local_b8[lVar6].components[0] =
           (char)((((uint)cVar4 & 0xff) - (uint)local_b8[lVar6].components[0]) * iVar5 >> 0x16) +
           local_b8[lVar6].components[0];
      local_b8[lVar6].components[1] =
           (char)((((uint)cVar4 >> 8 & 0xff) - (uint)local_b8[lVar6].components[1]) * iVar5 >> 0x16)
           + local_b8[lVar6].components[1];
      local_b8[lVar6].components[2] =
           (char)((((uint)cVar4 >> 0x10 & 0xff) - (uint)local_b8[lVar6].components[2]) * iVar5 >>
                 0x16) + local_b8[lVar6].components[2];
    }
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 4);
  local_38._0_1_ = '!';
  local_38._1_1_ = 0x80;
  local_38._2_1_ = 0xde;
  local_38._3_1_ = '\0';
  local_38._4_1_ = '*';
  local_38._5_1_ = 0x80;
  local_38._6_1_ = 0xd5;
  local_38._7_1_ = '\0';
  uStack_30._0_1_ = '+';
  uStack_30._1_1_ = 0x80;
  uStack_30._2_1_ = 0xd4;
  uStack_30._3_1_ = '\0';
  uStack_30._4_1_ = '.';
  uStack_30._5_1_ = 0x80;
  uStack_30._6_1_ = 0xd1;
  uStack_30._7_1_ = '\0';
  local_48.components[0] = '$';
  local_48.components[1] = 0x80;
  local_48.components[2] = 0xdb;
  local_48.components[3] = '\0';
  uStack_44 = 0xb78048;
  uStack_40 = 0xb2804d;
  uStack_3c = 0xa5805a;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_70,&local_90,0xee);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,4ul>
            ((pixel_rgbx<agge::order_rgba> (*) [4])&local_38,
             (pixel_rgbx<agge::order_rgba> (*) [4])local_a8,&local_70);
  paVar2 = &local_70.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_70,&local_90,0xef);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,4ul>
            ((pixel_rgbx<agge::order_rgba> (*) [4])&local_48,&local_b8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( AlphaIsMixedFromSrcAlphaAndCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 4;
				const pixel back = { { 0x20, 0x80, 0xE0, 0x80 } };
				const uint8_t covers[n] = { 0x10, 0x90, 0xA0, 0xD0, };
				blender_solid_color_rgb<pixel, order_rgba> b1(color::make(0x80, 0x80, 0x80, 0x30));
				blender_solid_color_rgb<pixel, order_rgba> b2(color::make(0x80, 0x80, 0x80, 0xC0));
				pixel dest1[n];
				pixel dest2[n];

				fill_n(dest1, n, back);
				fill_n(dest2, n, back);

				// ACT
				b1(dest1, 0, 0, n, covers);
				b2(dest2, 0, 0, n, covers);

				// ASSERT
				pixel reference1[] = {
					{ { 0x21, 0x80, 0xDE, } },
					{ { 0x2A, 0x80, 0xD5, } },
					{ { 0x2B, 0x80, 0xD4, } },
					{ { 0x2E, 0x80, 0xD1, } },
				};
				pixel reference2[] = {
					{ { 0x24, 0x80, 0xDB, } },
					{ { 0x48, 0x80, 0xB7, } },
					{ { 0x4D, 0x80, 0xB2, } },
					{ { 0x5A, 0x80, 0xA5, } },
				};

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
			}